

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_crt_verify_restartable_ca_cb
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_ca_cb_t f_ca_cb,void *p_ca_cb,mbedtls_x509_crt_profile *profile,
              char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy,
              mbedtls_x509_crt_restart_ctx *rs_ctx)

{
  mbedtls_asn1_sequence **ppmVar1;
  short *psVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  mbedtls_pk_type_t mVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  mbedtls_md_info_t *md_info;
  uint uVar12;
  uint uVar13;
  mbedtls_x509_sequence *cur;
  mbedtls_asn1_named_data *pmVar14;
  mbedtls_asn1_sequence *pmVar15;
  uint *puVar16;
  mbedtls_x509_crt *pmVar17;
  mbedtls_x509_buf *name;
  uint uVar18;
  mbedtls_x509_sequence *cur_1;
  size_t __n;
  mbedtls_asn1_sequence *pmVar19;
  bool bVar20;
  undefined8 uStack_148;
  mbedtls_x509_crt *local_140;
  uint local_138 [40];
  uint local_98 [2];
  uint32_t ip [4];
  int local_4c;
  
  *(undefined4 *)p_ca_cb = 0;
  lVar8 = 8;
  do {
    *(undefined8 *)((long)&uStack_148 + lVar8) = 0;
    *(undefined4 *)((long)local_138 + lVar8 + -8) = 0xffffffff;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0xa8);
  if (ca_crl == (mbedtls_x509_crl *)0x0) {
    iVar5 = -0x2800;
LAB_0020dd08:
    *(undefined4 *)p_ca_cb = 0xffffffff;
    return iVar5;
  }
  uVar18 = 0;
  if (f_ca_cb != (mbedtls_x509_crt_ca_cb_t)0x0) {
    sVar9 = strlen((char *)f_ca_cb);
    if ((crt->ext_types & 0x20) == 0) {
      pmVar14 = &crt->subject;
      do {
        if ((((pmVar14->oid).len == 3) &&
            (psVar2 = (short *)(pmVar14->oid).p, (char)psVar2[1] == '\x03' && *psVar2 == 0x455)) &&
           (iVar5 = x509_crt_check_cn(&pmVar14->val,(char *)f_ca_cb,sVar9), iVar5 == 0))
        goto LAB_0020d945;
        pmVar14 = pmVar14->next;
      } while (pmVar14 != (mbedtls_asn1_named_data *)0x0);
    }
    else {
      pmVar15 = &crt->subject_alt_names;
      bVar20 = false;
      bVar3 = false;
      name = &pmVar15->buf;
      do {
        while (uVar18 = name->tag & 0x1f, uVar18 != 7) {
          if (uVar18 == 6) {
            bVar20 = true;
          }
          else if ((uVar18 == 2) &&
                  (iVar5 = x509_crt_check_cn(name,(char *)f_ca_cb,sVar9), iVar5 == 0))
          goto LAB_0020dd22;
          name = *(mbedtls_x509_buf **)(name + 1);
          if (name == (mbedtls_x509_buf *)0x0) {
            if (!bVar3) {
              if (bVar20) goto LAB_0020d90f;
              goto LAB_0020d93f;
            }
            goto LAB_0020d882;
          }
        }
        name = *(mbedtls_x509_buf **)(name + 1);
        bVar3 = true;
      } while (name != (mbedtls_x509_buf *)0x0);
LAB_0020d882:
      pcVar10 = strchr((char *)f_ca_cb,0x3a);
      __n = 0x10;
      if (pcVar10 == (char *)0x0) {
        __n = 4;
      }
      iVar5 = inet_pton((uint)(pcVar10 != (char *)0x0) * 8 + 2,(char *)f_ca_cb,local_98);
      pmVar19 = pmVar15;
      if (iVar5 == 1) {
        do {
          if (((((pmVar19->buf).tag & 0x1fU) == 7) && ((pmVar19->buf).len == __n)) &&
             (iVar5 = bcmp((pmVar19->buf).p,local_98,__n), iVar5 == 0)) goto LAB_0020dd22;
          ppmVar1 = &pmVar19->next;
          pmVar19 = *ppmVar1;
        } while (*ppmVar1 != (mbedtls_asn1_sequence *)0x0);
      }
      uVar18 = 4;
      if (!bVar20) goto LAB_0020d945;
LAB_0020d90f:
      do {
        if (((((pmVar15->buf).tag & 0x1fU) == 6) && ((pmVar15->buf).len == sVar9)) &&
           (iVar5 = bcmp((pmVar15->buf).p,f_ca_cb,sVar9), iVar5 == 0)) goto LAB_0020dd22;
        pmVar15 = pmVar15->next;
      } while (pmVar15 != (mbedtls_asn1_sequence *)0x0);
    }
LAB_0020d93f:
    uVar18 = 4;
  }
LAB_0020d945:
  mVar6 = mbedtls_pk_get_type(&crt->pk);
  if ((mVar6 == MBEDTLS_PK_NONE) ||
     ((*(uint *)&(ca_crl->raw).field_0x4 >> ((byte)((char)mVar6 - 1) & 0x1f) & 1) == 0)) {
    uVar18 = uVar18 | 0x8000;
  }
  iVar5 = x509_profile_check_key((mbedtls_x509_crt_profile *)ca_crl,&crt->pk);
  uVar12 = uVar18 + 0x10000;
  if (iVar5 == 0) {
    uVar12 = uVar18;
  }
  puVar16 = local_138;
  local_140 = crt;
  local_138[0] = 0;
  local_138[0x26] = 1;
  uVar11 = 0;
  local_4c = 0;
LAB_0020d9c5:
  uVar18 = local_138[0x26];
  if ((crt->sig_md == MBEDTLS_MD_NONE) ||
     (uVar13 = 0x8000, ((uint)(ca_crl->raw).tag >> ((byte)((char)crt->sig_md - 1) & 0x1f) & 1) == 0)
     ) {
    *puVar16 = 0x4000;
    uVar13 = 0xc000;
  }
  if ((crt->sig_pk == MBEDTLS_PK_NONE) ||
     ((*(uint *)&(ca_crl->raw).field_0x4 >> ((byte)((char)crt->sig_pk - 1) & 0x1f) & 1) == 0)) {
    *puVar16 = uVar13;
  }
  if ((((int)uVar11 == 0) && (iVar5 = x509_name_cmp(&crt->issuer,&crt->subject), iVar5 == 0)) &&
     (trust_ca != (mbedtls_x509_crt *)0x0)) {
    sVar9 = (crt->raw).len;
    pmVar17 = trust_ca;
    do {
      if ((sVar9 == (pmVar17->raw).len) &&
         (iVar5 = bcmp((crt->raw).p,(pmVar17->raw).p,sVar9), iVar5 == 0)) goto LAB_0020dc7d;
      pmVar17 = pmVar17->next;
    } while (pmVar17 != (mbedtls_x509_crt *)0x0);
  }
  bVar3 = false;
  pmVar17 = trust_ca;
LAB_0020da4c:
  while (pmVar17 == (mbedtls_x509_crt *)0x0) {
    if (bVar3) {
      *(byte *)puVar16 = (byte)*puVar16 | 8;
      uVar18 = local_138[0x26];
      goto LAB_0020dc7d;
    }
    bVar3 = true;
    pmVar17 = crt->next;
  }
  iVar5 = x509_name_cmp(&crt->issuer,&pmVar17->subject);
  if (((iVar5 == 0) &&
      (((!bVar3 && (pmVar17->version < 3)) ||
       ((pmVar17->ca_istrue != 0 &&
        (((pmVar17->ext_types & 4) == 0 || ((pmVar17->key_usage & 0x8005) == 4)))))))) &&
     ((pmVar17->max_pathlen < 1 || (uVar18 - local_4c <= (uint)pmVar17->max_pathlen)))) {
    md_info = mbedtls_md_info_from_type(crt->sig_md);
    bVar4 = mbedtls_md_get_size(md_info);
    iVar5 = mbedtls_md(md_info,(crt->tbs).p,(crt->tbs).len,(uchar *)local_98);
    if (iVar5 == 0) {
      iVar5 = mbedtls_pk_can_do(&pmVar17->pk,crt->sig_pk);
      if (iVar5 == 0) goto LAB_0020daed;
      iVar5 = mbedtls_pk_verify_ext
                        (crt->sig_pk,crt->sig_opts,&pmVar17->pk,crt->sig_md,(uchar *)local_98,
                         (ulong)bVar4,(crt->sig).p,(crt->sig).len);
      bVar20 = iVar5 == 0;
    }
    else {
LAB_0020daed:
      bVar20 = false;
    }
    uVar13 = local_138[0x26];
    if (bVar3 || bVar20) goto code_r0x0020db7a;
  }
  pmVar17 = pmVar17->next;
  goto LAB_0020da4c;
LAB_0020dd22:
  uVar18 = 0;
  goto LAB_0020d945;
code_r0x0020db7a:
  if (local_138[0x26] != 1) {
    iVar5 = x509_name_cmp(&crt->issuer,&crt->subject);
    local_4c = local_4c + (uint)(iVar5 == 0);
    if ((bool)(bVar3 & 8 < uVar13)) {
      iVar5 = -0x3000;
      goto LAB_0020dd08;
    }
  }
  if (!bVar20) {
    *(byte *)puVar16 = (byte)*puVar16 | 8;
  }
  iVar5 = x509_profile_check_key((mbedtls_x509_crt_profile *)ca_crl,&pmVar17->pk);
  if (iVar5 != 0) {
    *(byte *)((long)puVar16 + 2) = *(byte *)((long)puVar16 + 2) | 1;
  }
  uVar11 = (ulong)local_138[0x26];
  puVar16 = local_138 + uVar11 * 4;
  *(mbedtls_x509_crt **)(local_138 + uVar11 * 4 + -2) = pmVar17;
  *puVar16 = 0;
  uVar18 = local_138[0x26] + 1;
  local_138[0x26] = uVar18;
  crt = pmVar17;
  if (!bVar3) goto LAB_0020dc7d;
  goto LAB_0020d9c5;
LAB_0020dc7d:
  local_138[0] = local_138[0] | uVar12;
  if (uVar18 == 0) {
    local_98[0] = *p_ca_cb;
  }
  else {
    uVar11 = (ulong)(uVar18 - 1);
    puVar16 = local_138 + uVar11 * 4;
    do {
      local_98[0] = *puVar16;
      iVar5 = (int)uVar11;
      if ((profile != (mbedtls_x509_crt_profile *)0x0) &&
         (iVar7 = (*(code *)profile)(cn,*(undefined8 *)(puVar16 + -2),uVar11,local_98), iVar7 != 0))
      {
        iVar5 = -0x3000;
        if (iVar7 != -0x2700) {
          iVar5 = iVar7;
        }
        goto LAB_0020dd08;
      }
      local_98[0] = local_98[0] | *p_ca_cb;
      *(uint *)p_ca_cb = local_98[0];
      puVar16 = puVar16 + -4;
      uVar11 = (ulong)(iVar5 - 1);
    } while (iVar5 != 0);
  }
  iVar5 = -0x2700;
  if (local_98[0] == 0) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int x509_crt_verify_restartable_ca_cb(mbedtls_x509_crt *crt,
                                             mbedtls_x509_crt *trust_ca,
                                             mbedtls_x509_crl *ca_crl,
                                             mbedtls_x509_crt_ca_cb_t f_ca_cb,
                                             void *p_ca_cb,
                                             const mbedtls_x509_crt_profile *profile,
                                             const char *cn, uint32_t *flags,
                                             int (*f_vrfy)(void *,
                                                           mbedtls_x509_crt *,
                                                           int,
                                                           uint32_t *),
                                             void *p_vrfy,
                                             mbedtls_x509_crt_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_pk_type_t pk_type;
    mbedtls_x509_crt_verify_chain ver_chain;
    uint32_t ee_flags;

    *flags = 0;
    ee_flags = 0;
    x509_crt_verify_chain_reset(&ver_chain);

    if (profile == NULL) {
        ret = MBEDTLS_ERR_X509_BAD_INPUT_DATA;
        goto exit;
    }

    /* check name if requested */
    if (cn != NULL) {
        x509_crt_verify_name(crt, cn, &ee_flags);
    }

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type(&crt->pk);

    if (x509_profile_check_pk_alg(profile, pk_type) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_PK;
    }

    if (x509_profile_check_key(profile, &crt->pk) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_KEY;
    }

    /* Check the chain */
    ret = x509_crt_verify_chain(crt, trust_ca, ca_crl,
                                f_ca_cb, p_ca_cb, profile,
                                &ver_chain, rs_ctx);

    if (ret != 0) {
        goto exit;
    }

    /* Merge end-entity flags */
    ver_chain.items[0].flags |= ee_flags;

    /* Build final flags, calling callback on the way if any */
    ret = x509_crt_merge_flags_with_cb(flags, &ver_chain, f_vrfy, p_vrfy);

exit:

#if defined(MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK)
    mbedtls_x509_crt_free(ver_chain.trust_ca_cb_result);
    mbedtls_free(ver_chain.trust_ca_cb_result);
    ver_chain.trust_ca_cb_result = NULL;
#endif /* MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK */

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && ret != MBEDTLS_ERR_ECP_IN_PROGRESS) {
        mbedtls_x509_crt_restart_free(rs_ctx);
    }
#endif

    /* prevent misuse of the vrfy callback - VERIFY_FAILED would be ignored by
     * the SSL module for authmode optional, but non-zero return from the
     * callback means a fatal error so it shouldn't be ignored */
    if (ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED) {
        ret = MBEDTLS_ERR_X509_FATAL_ERROR;
    }

    if (ret != 0) {
        *flags = (uint32_t) -1;
        return ret;
    }

    if (*flags != 0) {
        return MBEDTLS_ERR_X509_CERT_VERIFY_FAILED;
    }

    return 0;
}